

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
IsObjTypeSpecEquivalentImpl<false>
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,Type *type,
          EquivalentPropertyEntry *entry)

{
  ushort uVar1;
  int iVar2;
  code *pcVar3;
  bool bVar4;
  ScriptContext *this_00;
  undefined4 *puVar5;
  ushort uVar6;
  ushort uVar7;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  SimpleDictionaryPropertyDescriptor<int> *pSStack_30;
  int i;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  
  this_00 = Js::Type::GetScriptContext(type);
  local_40 = ScriptContext::GetPropertyName(this_00,entry->propertyId);
  bVar4 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_40,&stack0xffffffffffffffd0,
                     (int *)((long)&propertyRecord + 4));
  if (((bVar4) && ((pSStack_30->Attributes & 8) == 0)) &&
     (iVar2 = pSStack_30->propertyIndex, iVar2 < 0xffff)) {
    uVar7 = (ushort)iVar2;
    if (uVar7 == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                  ,0xaf,"(slotIndex != Constants::NoSlot)",
                                  "slotIndex != Constants::NoSlot");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    uVar1 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
    uVar6 = -uVar1;
    if (uVar7 < uVar1) {
      uVar6 = (this->super_DynamicTypeHandler).offsetOfInlineSlots >> 3;
    }
    if ((ushort)(uVar6 + uVar7) != 0xffff) {
      if ((ushort)(uVar6 + uVar7) != entry->slotIndex) {
        return false;
      }
      if (entry->isAuxSlot != (int)(uint)uVar1 <= iVar2) {
        return false;
      }
      if (entry->mustBeWritable != true) {
        return true;
      }
      if ((pSStack_30->Attributes & 4) != 0) {
        if (((ulong)*pSStack_30 & 6) == 2) {
          return true;
        }
        return false;
      }
      return false;
    }
  }
  if ((entry->slotIndex == 0xffff) && (entry->mustBeWritable == false)) {
    return true;
  }
  return false;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::IsObjTypeSpecEquivalentImpl(const Type* type, const EquivalentPropertyEntry *entry)
    {
        TPropertyIndex absSlotIndex = Constants::NoSlot;
        PropertyIndex relSlotIndex = Constants::NoSlot;

        ScriptContext* scriptContext = type->GetScriptContext();

        const PropertyRecord* propertyRecord =
            doLock ? scriptContext->GetPropertyNameLocked(entry->propertyId) : scriptContext->GetPropertyName(entry->propertyId);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        if (this->propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            absSlotIndex = descriptor->propertyIndex;
            if (absSlotIndex <= Constants::PropertyIndexMax)
            {
                relSlotIndex = AdjustValidSlotIndexForInlineSlots(static_cast<PropertyIndex>(absSlotIndex));
            }
        }

        if (relSlotIndex != Constants::NoSlot)
        {
            if (relSlotIndex != entry->slotIndex || ((absSlotIndex >= GetInlineSlotCapacity()) != entry->isAuxSlot))
            {
                return false;
            }

            if (entry->mustBeWritable && (!(descriptor->Attributes & PropertyWritable) || descriptor->IsOrMayBecomeFixed()))
            {
                return false;
            }
        }
        else
        {
            if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
            {
                return false;
            }
        }

        return true;
    }